

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_scalevalues(int *idata,long tilelen,double scale,double zero,int *status)

{
  long lVar1;
  int iVar2;
  double dVar3;
  
  lVar1 = 0;
  if (tilelen < 1) {
    tilelen = lVar1;
  }
  for (; tilelen != lVar1; lVar1 = lVar1 + 1) {
    dVar3 = ((double)idata[lVar1] - zero) / scale;
    if (-2147483648.49 <= dVar3) {
      if (dVar3 <= 2147483647.49) {
        if (0.0 <= dVar3) {
          dVar3 = dVar3 + 0.5;
        }
        else {
          dVar3 = dVar3 + -0.5;
        }
        iVar2 = (int)dVar3;
      }
      else {
        *status = -0xb;
        iVar2 = 0x7fffffff;
      }
    }
    else {
      *status = -0xb;
      iVar2 = -0x80000000;
    }
    idata[lVar1] = iVar2;
  }
  return *status;
}

Assistant:

int imcomp_scalevalues(
     int *idata, 
     long tilelen,
     double scale,
     double zero,
     int *status)
/*
   do inverse scaling the integer values.
*/
{
    long ii;
    double dvalue;
    
    for (ii=0; ii < tilelen; ii++)
    {
            dvalue = (idata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
    }
    return(*status);
}